

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O3

int __thiscall
diy::AMRLink::clone(AMRLink *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x1a0);
  *puVar1 = &PTR_id_abi_cxx11__0014a7c0;
  std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::vector
            ((vector<diy::BlockID,_std::allocator<diy::BlockID>_> *)(puVar1 + 1),
             &(this->super_Registrar<diy::AMRLink>).super_Link.neighbors_);
  *puVar1 = &PTR_id_abi_cxx11__0014a780;
  *(int *)(puVar1 + 4) = this->dim_;
  Description::Description((Description *)(puVar1 + 5),&this->local_);
  std::vector<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>::vector
            ((vector<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_> *)
             (puVar1 + 0x2e),&this->nbr_descriptions_);
  std::vector<diy::Direction,_std::allocator<diy::Direction>_>::vector
            ((vector<diy::Direction,_std::allocator<diy::Direction>_> *)(puVar1 + 0x31),&this->wrap_
            );
  return (int)puVar1;
}

Assistant:

Link*         clone() const override                  { return new AMRLink(*this); }